

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::parse_value<std::__cxx11::string>
               (string *text,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *value)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ulong uVar3;
  istream *piVar4;
  bool local_222;
  undefined1 local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v_1;
  string token;
  stringstream in;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *value_local;
  string *text_local;
  
  v.field_2._8_8_ = value;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(token.field_2._M_local_buf + 8),(string *)text,_Var2);
    std::__cxx11::string::string((string *)(v_1.field_2._M_local_buf + 8));
    while( true ) {
      bVar1 = std::ios::eof();
      local_222 = false;
      if ((bVar1 & 1) == 0) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)(token.field_2._M_local_buf + 8),
                            (string *)(v_1.field_2._M_local_buf + 8),',');
        local_222 = std::ios::operator_cast_to_bool
                              ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      }
      if (local_222 == false) break;
      std::__cxx11::string::string((string *)local_210);
      parse_value((string *)((long)&v_1.field_2 + 8),(string *)local_210);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 v.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
      std::__cxx11::string::~string((string *)local_210);
    }
    std::__cxx11::string::~string((string *)(v_1.field_2._M_local_buf + 8));
    std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::string((string *)local_38);
    parse_value(text,(string *)local_38);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)v.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void
    parse_value(const std::string& text, std::vector<T>& value)
    {
      if (text.empty()) {
        T v;
        parse_value(text, v);
        value.emplace_back(std::move(v));
        return;
      }
      std::stringstream in(text);
      std::string token;
      while(!in.eof() && std::getline(in, token, CXXOPTS_VECTOR_DELIMITER)) {
        T v;
        parse_value(token, v);
        value.emplace_back(std::move(v));
      }
    }